

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void __thiscall GB::add_sp_n(GB *this)

{
  u16 uVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  
  lVar2 = (this->s).op_tick;
  if (lVar2 == 0x1e) {
    (this->s).op_tick = -2;
  }
  else if (lVar2 == 0xe) {
    uVar1 = (this->s).pc;
    (this->s).pc = uVar1 + 1;
    bVar3 = Read(this,uVar1);
    uVar1 = (this->s).sp;
    bVar4 = (byte)uVar1;
    uVar5 = (uint)bVar4 + (uint)bVar3;
    (this->s).field_2.field_0.f =
         (byte)(uVar5 >> 4) & 0x10 | ((byte)uVar5 ^ bVar4 ^ bVar3) * '\x02' & 0x20;
    (this->s).sp = (short)(char)bVar3 + uVar1;
  }
  return;
}

Assistant:

void GB::add_sp_n() {
  switch (s.op_tick) {
    case 14: s.sp = add_sp(read_n()); break;
    case 30: op_done(); break;
  }
}